

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O2

void __thiscall TEST_SimpleString_Contains_Test::testBody(TEST_SimpleString_Contains_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  SimpleString s;
  SimpleString empty;
  SimpleString notPartOfString;
  SimpleString mid;
  SimpleString end;
  SimpleString beginning;
  
  SimpleString::SimpleString(&s,"hello!");
  SimpleString::SimpleString(&empty,"");
  SimpleString::SimpleString(&beginning,"hello");
  SimpleString::SimpleString(&end,"lo!");
  SimpleString::SimpleString(&mid,"l");
  SimpleString::SimpleString(&notPartOfString,"xxxx");
  pUVar2 = UtestShell::getCurrent();
  bVar1 = SimpleString::contains(&s,&empty);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","s.contains(empty)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x156,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = SimpleString::contains(&s,&beginning);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","s.contains(beginning)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x157,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = SimpleString::contains(&s,&end);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","s.contains(end)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x158,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = SimpleString::contains(&s,&mid);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","s.contains(mid)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x159,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = SimpleString::contains(&s,&notPartOfString);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!s.contains(notPartOfString)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x15a,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = SimpleString::contains(&empty,&empty);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","empty.contains(empty)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x15c,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = SimpleString::contains(&empty,&s);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!empty.contains(s)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x15d,pTVar3);
  SimpleString::~SimpleString(&notPartOfString);
  SimpleString::~SimpleString(&mid);
  SimpleString::~SimpleString(&end);
  SimpleString::~SimpleString(&beginning);
  SimpleString::~SimpleString(&empty);
  SimpleString::~SimpleString(&s);
  return;
}

Assistant:

TEST(SimpleString, Contains)
{
    SimpleString s("hello!");
    SimpleString empty("");
    SimpleString beginning("hello");
    SimpleString end("lo!");
    SimpleString mid("l");
    SimpleString notPartOfString("xxxx");

    CHECK(s.contains(empty));
    CHECK(s.contains(beginning));
    CHECK(s.contains(end));
    CHECK(s.contains(mid));
    CHECK(!s.contains(notPartOfString));

    CHECK(empty.contains(empty));
    CHECK(!empty.contains(s));
}